

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O0

bool bssl::tls12_check_peer_sigalg
               (SSL_HANDSHAKE *hs,uint8_t *out_alert,uint16_t sigalg,EVP_PKEY *pkey)

{
  bool bVar1;
  iterator puVar2;
  iterator __last;
  unsigned_short *puVar3;
  undefined1 local_40 [8];
  Span<const_unsigned_short> sigalgs;
  EVP_PKEY *pkey_local;
  uint8_t *puStack_20;
  uint16_t sigalg_local;
  uint8_t *out_alert_local;
  SSL_HANDSHAKE *hs_local;
  
  sigalgs.size_ = (size_t)pkey;
  pkey_local._6_2_ = sigalg;
  puStack_20 = out_alert;
  out_alert_local = (uint8_t *)hs;
  _local_40 = tls12_get_verify_sigalgs(hs);
  puVar2 = Span<const_unsigned_short>::begin((Span<const_unsigned_short> *)local_40);
  __last = Span<const_unsigned_short>::end((Span<const_unsigned_short> *)local_40);
  puVar3 = std::find<unsigned_short_const*,unsigned_short>
                     (puVar2,__last,(unsigned_short *)((long)&pkey_local + 6));
  puVar2 = Span<const_unsigned_short>::end((Span<const_unsigned_short> *)local_40);
  if ((puVar3 != puVar2) &&
     (bVar1 = ssl_pkey_supports_algorithm
                        (*(SSL **)out_alert_local,(EVP_PKEY *)sigalgs.size_,pkey_local._6_2_,true),
     bVar1)) {
    return true;
  }
  ERR_put_error(0x10,0,0xf5,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                ,0x157);
  *puStack_20 = '/';
  return false;
}

Assistant:

bool tls12_check_peer_sigalg(const SSL_HANDSHAKE *hs, uint8_t *out_alert,
                             uint16_t sigalg, EVP_PKEY *pkey) {
  // The peer must have selected an algorithm that is consistent with its public
  // key, the TLS version, and what we advertised.
  Span<const uint16_t> sigalgs = tls12_get_verify_sigalgs(hs);
  if (std::find(sigalgs.begin(), sigalgs.end(), sigalg) == sigalgs.end() ||
      !ssl_pkey_supports_algorithm(hs->ssl, pkey, sigalg, /*is_verify=*/true)) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_WRONG_SIGNATURE_TYPE);
    *out_alert = SSL_AD_ILLEGAL_PARAMETER;
    return false;
  }

  return true;
}